

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

int Ssw_ManSetConstrPhases(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  int iVar1;
  int Entry;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int iVar4;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  pAig = Ssw_FramesWithConstraints(p,nFrames);
  p_00 = Cnf_Derive(pAig,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar1 == 1 && pvInits != (Vec_Int_t **)0x0) {
      pVVar2 = Vec_IntAlloc(1000);
      *pvInits = pVVar2;
      for (; iVar4 < pAig->vCis->nSize; iVar4 = iVar4 + 1) {
        pvVar3 = Vec_PtrEntry(pAig->vCis,iVar4);
        pVVar2 = *pvInits;
        Entry = sat_solver_var_value(s,p_00->pVarNums[*(int *)((long)pvVar3 + 0x24)]);
        Vec_IntPush(pVVar2,Entry);
      }
    }
    sat_solver_delete(s);
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    iVar4 = 1;
    if (iVar1 != -1) {
      iVar4 = -(uint)(iVar1 != 1);
    }
  }
  return iVar4;
}

Assistant:

int Ssw_ManSetConstrPhases( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, RetValue;
    if ( pvInits )
        *pvInits = NULL;
//    assert( p->nConstrs > 0 );
    // derive the timeframes
    pFrames = Ssw_FramesWithConstraints( p, nFrames );
    // create CNF
    pCnf = Cnf_Derive( pFrames, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }
    // solve
    RetValue = sat_solver_solve( pSat, NULL, NULL,
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        Aig_ManForEachCi( pFrames, pObj, i )
            Vec_IntPush( *pvInits, sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) );

//        Aig_ManForEachCi( pFrames, pObj, i )
//            Abc_Print( 1, "%d", Vec_IntEntry(*pvInits, i) );
//        Abc_Print( 1, "\n" );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}